

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O3

void aom_get_var_sse_sum_16x16_dual_avx2
               (uint8_t *src_ptr,int source_stride,uint8_t *ref_ptr,int ref_stride,
               uint32_t *sse16x16,uint *tot_sse,int *tot_sum,uint32_t *var16x16)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  iVar5 = 0x10;
  auVar9._8_2_ = 0xff01;
  auVar9._0_8_ = 0xff01ff01ff01ff01;
  auVar9._10_2_ = 0xff01;
  auVar9._12_2_ = 0xff01;
  auVar9._14_2_ = 0xff01;
  auVar9._16_2_ = 0xff01;
  auVar9._18_2_ = 0xff01;
  auVar9._20_2_ = 0xff01;
  auVar9._22_2_ = 0xff01;
  auVar9._24_2_ = 0xff01;
  auVar9._26_2_ = 0xff01;
  auVar9._28_2_ = 0xff01;
  auVar9._30_2_ = 0xff01;
  auVar10 = ZEXT1664((undefined1  [16])0x0);
  auVar11 = ZEXT1664((undefined1  [16])0x0);
  do {
    auVar4 = vpunpcklbw_avx2(*(undefined1 (*) [32])src_ptr,*(undefined1 (*) [32])ref_ptr);
    auVar3 = vpunpckhbw_avx2(*(undefined1 (*) [32])src_ptr,*(undefined1 (*) [32])ref_ptr);
    auVar4 = vpmaddubsw_avx2(auVar4,auVar9);
    auVar3 = vpmaddubsw_avx2(auVar3,auVar9);
    auVar1 = vpmaddwd_avx2(auVar4,auVar4);
    auVar1 = vpaddd_avx2(auVar1,auVar8._0_32_);
    auVar8 = ZEXT3264(auVar1);
    auVar2 = vpmaddwd_avx2(auVar3,auVar3);
    auVar2 = vpaddd_avx2(auVar2,auVar11._0_32_);
    auVar11 = ZEXT3264(auVar2);
    auVar4 = vpaddw_avx2(auVar4,auVar6._0_32_);
    auVar6 = ZEXT3264(auVar4);
    auVar3 = vpaddw_avx2(auVar3,auVar10._0_32_);
    auVar10 = ZEXT3264(auVar3);
    src_ptr = *(undefined1 (*) [32])src_ptr + source_stride;
    ref_ptr = *(undefined1 (*) [32])ref_ptr + ref_stride;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  auVar1 = vphaddd_avx2(auVar1,auVar2);
  auVar9 = vphaddw_avx2(auVar4,auVar3);
  auVar7 = vphaddw_avx(auVar9._0_16_,auVar9._16_16_);
  auVar9 = vpmovsxwd_avx2(auVar7);
  auVar9 = vphaddd_avx2(auVar1,auVar9);
  auVar9 = vpermq_avx2(auVar9,0xd8);
  auVar9 = vphaddd_avx2(auVar9,auVar9);
  auVar4 = vphaddd_avx2(auVar9,auVar9);
  *tot_sse = *tot_sse + auVar4._0_4_;
  *tot_sum = *tot_sum + auVar4._16_4_;
  *(long *)sse16x16 = auVar9._0_8_;
  auVar7 = vpmulld_avx(auVar9._16_16_,auVar9._16_16_);
  auVar7 = vpsrld_avx(auVar7,8);
  auVar7 = vpsubd_avx(auVar9._0_16_,auVar7);
  *(long *)var16x16 = auVar7._0_8_;
  return;
}

Assistant:

void aom_get_var_sse_sum_16x16_dual_avx2(const uint8_t *src_ptr,
                                         int source_stride,
                                         const uint8_t *ref_ptr, int ref_stride,
                                         uint32_t *sse16x16,
                                         unsigned int *tot_sse, int *tot_sum,
                                         uint32_t *var16x16) {
  get_var_sse_sum_16x16_dual_avx2(src_ptr, source_stride, ref_ptr, ref_stride,
                                  16, sse16x16, tot_sse, tot_sum, var16x16);
}